

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yaml_parser_parse_block_mapping_key(yaml_parser_t *parser,yaml_event_t *event,int first)

{
  yaml_mark_t **ppyVar1;
  yaml_parser_state_t **top;
  yaml_token_type_t yVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  yaml_mark_t mark_00;
  int iVar9;
  int iVar10;
  yaml_mark_t *pyVar11;
  yaml_parser_state_t *pyVar12;
  yaml_token_t *pyVar13;
  yaml_mark_t mark;
  
  if (first == 0) {
    if (parser->token_available == 0) goto LAB_00193c5d;
LAB_00193c6d:
    pyVar13 = (parser->tokens).head;
    iVar9 = 0;
    if (pyVar13 != (yaml_token_t *)0x0) {
      if (pyVar13->type == YAML_BLOCK_END_TOKEN) {
        pyVar12 = (parser->states).top;
        (parser->states).top = pyVar12 + -1;
        parser->state = pyVar12[-1];
        ppyVar1 = &(parser->marks).top;
        *ppyVar1 = *ppyVar1 + -1;
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->end_mark).column = 0;
        event->type = YAML_MAPPING_END_EVENT;
        (event->start_mark).column = (pyVar13->start_mark).column;
        sVar3 = (pyVar13->start_mark).line;
        (event->start_mark).index = (pyVar13->start_mark).index;
        (event->start_mark).line = sVar3;
        (event->end_mark).column = (pyVar13->end_mark).column;
        sVar3 = (pyVar13->end_mark).line;
        (event->end_mark).index = (pyVar13->end_mark).index;
        (event->end_mark).line = sVar3;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        pyVar13 = (parser->tokens).head;
        parser->stream_end_produced = (uint)(pyVar13->type == YAML_STREAM_END_TOKEN);
        (parser->tokens).head = pyVar13 + 1;
        iVar9 = 1;
      }
      else if (pyVar13->type == YAML_KEY_TOKEN) {
        mark_00 = pyVar13->end_mark;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar13 + 1;
        iVar10 = yaml_parser_fetch_more_tokens(parser);
        iVar9 = 0;
        if ((iVar10 != 0) &&
           (pyVar13 = (parser->tokens).head, iVar9 = 0, pyVar13 != (yaml_token_t *)0x0)) {
          yVar2 = pyVar13->type;
          if ((yVar2 < YAML_ALIAS_TOKEN) &&
             ((0x30200U >> (yVar2 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) != 0)) {
            parser->state = YAML_PARSE_BLOCK_MAPPING_VALUE_STATE;
            iVar9 = yaml_parser_process_empty_scalar(parser,event,mark_00);
          }
          else {
            pyVar12 = (parser->states).top;
            if (pyVar12 == (parser->states).end) {
              top = &(parser->states).top;
              iVar9 = yaml_stack_extend(&(parser->states).start,top,&(parser->states).end);
              if (iVar9 == 0) {
                parser->error = YAML_MEMORY_ERROR;
                return 0;
              }
              pyVar12 = *top;
            }
            (parser->states).top = pyVar12 + 1;
            *pyVar12 = YAML_PARSE_BLOCK_MAPPING_VALUE_STATE;
            iVar9 = yaml_parser_parse_node(parser,event,1,1);
          }
        }
      }
      else {
        pyVar11 = (parser->marks).top;
        (parser->marks).top = pyVar11 + -1;
        sVar3 = (pyVar13->start_mark).column;
        sVar5 = (pyVar13->start_mark).index;
        sVar6 = (pyVar13->start_mark).line;
        sVar7 = pyVar11[-1].index;
        sVar8 = pyVar11[-1].line;
        sVar4 = pyVar11[-1].column;
        parser->error = YAML_PARSER_ERROR;
        parser->context = "while parsing a block mapping";
        (parser->context_mark).index = sVar7;
        (parser->context_mark).line = sVar8;
        (parser->context_mark).column = sVar4;
        parser->problem = "did not find expected key";
        (parser->problem_mark).index = sVar5;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = sVar3;
        iVar9 = 0;
      }
    }
  }
  else {
    if ((parser->token_available == 0) &&
       (iVar9 = yaml_parser_fetch_more_tokens(parser), iVar9 == 0)) {
      pyVar13 = (yaml_token_t *)0x0;
    }
    else {
      pyVar13 = (parser->tokens).head;
    }
    pyVar11 = (parser->marks).top;
    if (pyVar11 == (parser->marks).end) {
      ppyVar1 = &(parser->marks).top;
      iVar9 = yaml_stack_extend(&(parser->marks).start,ppyVar1,&(parser->marks).end);
      if (iVar9 != 0) {
        pyVar11 = *ppyVar1;
        goto LAB_00193c0c;
      }
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
LAB_00193c0c:
      (parser->marks).top = pyVar11 + 1;
      pyVar11->column = (pyVar13->start_mark).column;
      sVar3 = (pyVar13->start_mark).line;
      pyVar11->index = (pyVar13->start_mark).index;
      pyVar11->line = sVar3;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar13 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar13->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar13 + 1;
LAB_00193c5d:
      iVar9 = yaml_parser_fetch_more_tokens(parser);
      if (iVar9 != 0) goto LAB_00193c6d;
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int
yaml_parser_parse_block_mapping_key(yaml_parser_t *parser,
        yaml_event_t *event, int first)
{
    yaml_token_t *token;

    if (first) {
        token = PEEK_TOKEN(parser);
        if (!PUSH(parser, parser->marks, token->start_mark))
            return 0;
        SKIP_TOKEN(parser);
    }

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type == YAML_KEY_TOKEN)
    {
        yaml_mark_t mark = token->end_mark;
        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) return 0;
        if (token->type != YAML_KEY_TOKEN &&
                token->type != YAML_VALUE_TOKEN &&
                token->type != YAML_BLOCK_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_BLOCK_MAPPING_VALUE_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 1, 1);
        }
        else {
            parser->state = YAML_PARSE_BLOCK_MAPPING_VALUE_STATE;
            return yaml_parser_process_empty_scalar(parser, event, mark);
        }
    }

    else if (token->type == YAML_BLOCK_END_TOKEN)
    {
        parser->state = POP(parser, parser->states);
        (void)POP(parser, parser->marks);
        MAPPING_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

    else
    {
        return yaml_parser_set_parser_error_context(parser,
                "while parsing a block mapping", POP(parser, parser->marks),
                "did not find expected key", token->start_mark);
    }
}